

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O1

double __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::spfL
          (APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
           *this,TreeIndexAPTED *t1,int t1_current_subtree,TreeIndexAPTED *t2,int t2_current_subtree
          ,bool treesSwapped)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> keyRoots;
  Matrix<double> forestdist;
  vector<int,_std::allocator<int>_> local_80;
  long local_68;
  long local_60;
  Matrix<double> local_58;
  
  lVar4 = (long)t2_current_subtree;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,
             (long)(t2->super_PreLToSize).prel_to_size_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar4],(allocator_type *)&local_58);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    memset(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start,0xff,
           ((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-4 - (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
  }
  uVar2 = computeKeyRoots(this,t2,t2_current_subtree,
                          (t2->super_PreLToLLD).prel_to_lld_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4],&local_80,0);
  local_68 = (long)t1_current_subtree;
  local_60 = lVar4;
  data_structures::Matrix<double>::Matrix
            (&local_58,
             (long)(t1->super_PreLToSize).prel_to_size_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_68] + 1,
             (long)(t2->super_PreLToSize).prel_to_size_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar4] + 1);
  for (uVar5 = (ulong)uVar2; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
    treeEditDist(this,t1,t2,t1_current_subtree,
                 local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5 - 1],&local_58,treesSwapped);
  }
  pdVar3 = data_structures::Matrix<double>::read_at
                     (&local_58,
                      (long)(t1->super_PreLToSize).prel_to_size_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_68],
                      (long)(t2->super_PreLToSize).prel_to_size_.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_60]);
  dVar1 = *pdVar3;
  if (local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar1;
}

Assistant:

double APTEDTreeIndex<CostModel, TreeIndex>::spfL(const TreeIndex& t1,
    int t1_current_subtree, const TreeIndex& t2,
    int t2_current_subtree, bool treesSwapped) {
  // Initialise the array to store the keyroot nodes in the right-hand input
  // subtree.
  std::vector<int> keyRoots(t2.prel_to_size_[t2_current_subtree]);
  // Arrays.fill(keyRoots, -1);
  std::fill(keyRoots.begin(), keyRoots.end(), -1);
  // Get the leftmost leaf node of the right-hand input subtree.
  int pathID = t2.prel_to_lld_[t2_current_subtree];
  // Calculate the keyroot nodes in the right-hand input subtree.
  // firstKeyRoot is the index in keyRoots of the first keyroot node that
  // we have to process. We need this index because keyRoots array is larger
  // than the number of keyroot nodes.
  int firstKeyRoot = computeKeyRoots(t2, t2_current_subtree, pathID, keyRoots, 0);
  // Initialise an array to store intermediate distances for subforest pairs.
  data_structures::Matrix<double> forestdist(t1.prel_to_size_[t1_current_subtree]+1, t2.prel_to_size_[t2_current_subtree]+1);
  // Compute the distances between pairs of keyroot nodes. In the left-hand
  // input subtree only the root is the keyroot. Thus, we compute the distance
  // between the left-hand input subtree and all keyroot nodes in the
  // right-hand input subtree.
  for (int i = firstKeyRoot-1; i >= 0; --i) {
    treeEditDist(t1, t2, t1_current_subtree, keyRoots[i], forestdist, treesSwapped);
  }
  // Return the distance between the input subtrees.
  // std::cout << "spfL = " << forestdist.read_at(ni_1.preL_to_size_[ni_1.get_current_node()], ni_2.preL_to_size_[ni_2.get_current_node()]) << std::endl;
  return forestdist.read_at(t1.prel_to_size_[t1_current_subtree], t2.prel_to_size_[t2_current_subtree]);
}